

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ModportSubroutinePortSyntax::setChild
          (ModportSubroutinePortSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  FunctionPrototypeSyntax *local_120;
  string local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  FunctionPrototypeSyntax *local_28;
  FunctionPrototypeSyntax *local_20;
  size_t local_18;
  size_t index_local;
  ModportSubroutinePortSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_120 = (FunctionPrototypeSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_120 = SyntaxNode::as<slang::syntax::FunctionPrototypeSyntax>(pSVar1);
    }
    local_28 = local_120;
    not_null<slang::syntax::FunctionPrototypeSyntax*>::
    not_null<slang::syntax::FunctionPrototypeSyntax*,void>
              ((not_null<slang::syntax::FunctionPrototypeSyntax*> *)&local_20,&local_28);
    (this->prototype).ptr = local_20;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
             ,&local_c9);
  std::operator+(&local_a8,&local_c8,":");
  std::__cxx11::to_string(&local_100,0x20de);
  std::operator+(&local_88,&local_a8,&local_100);
  std::operator+(&local_68,&local_88,": ");
  std::operator+(&local_48,&local_68,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ModportSubroutinePortSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: prototype = child.node() ? &child.node()->as<FunctionPrototypeSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}